

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

ptls_fusion_aesgcm_context_t *
ptls_fusion_aesgcm_set_capacity(ptls_fusion_aesgcm_context_t *ctx,size_t capacity)

{
  size_t sVar1;
  ptls_fusion_aesgcm_context_t *in_RSI;
  ptls_fusion_aesgcm_context_t *in_RDI;
  size_t ghash_cnt;
  ptls_fusion_aesgcm_context_t *local_8;
  
  sVar1 = aesgcm_calc_ghash_cnt((size_t)in_RSI);
  local_8 = in_RDI;
  if (in_RDI->ghash_cnt < sVar1) {
    local_8 = (ptls_fusion_aesgcm_context_t *)realloc(in_RDI,sVar1 * 0x20 + 0x110);
    if (local_8 == (ptls_fusion_aesgcm_context_t *)0x0) {
      local_8 = (ptls_fusion_aesgcm_context_t *)0x0;
    }
    else {
      local_8->capacity = (size_t)in_RSI;
      while (sVar1 < local_8->ghash_cnt) {
        setup_one_ghash_entry(in_RSI);
      }
    }
  }
  return local_8;
}

Assistant:

ptls_fusion_aesgcm_context_t *ptls_fusion_aesgcm_set_capacity(ptls_fusion_aesgcm_context_t *ctx, size_t capacity)
{
    size_t ghash_cnt = aesgcm_calc_ghash_cnt(capacity);

    if (ghash_cnt <= ctx->ghash_cnt)
        return ctx;

    if ((ctx = realloc(ctx, sizeof(*ctx) + sizeof(ctx->ghash[0]) * ghash_cnt)) == NULL)
        return NULL;

    ctx->capacity = capacity;
    while (ghash_cnt < ctx->ghash_cnt)
        setup_one_ghash_entry(ctx);

    return ctx;
}